

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O1

bool beast::chop(string *what,string *input)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find((char *)input,(ulong)(what->_M_dataplus)._M_p,0);
  if (lVar1 == 0) {
    std::__cxx11::string::erase((ulong)input,0);
  }
  return lVar1 == 0;
}

Assistant:

bool chop (std::string const& what, std::string& input)
{
    auto ret = input.find (what);

    if (ret != 0)
        return false;

    input.erase (0, what.size ());
    return true;
}